

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBoneParent(OgreBinarySerializer *this,Skeleton *skeleton)

{
  unsigned_short id;
  unsigned_short id_00;
  Bone *bone;
  Bone *this_00;
  runtime_error *this_01;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  id = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  id_00 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  bone = Skeleton::BoneById(skeleton,id);
  this_00 = Skeleton::BoneById(skeleton,id_00);
  if ((bone != (Bone *)0x0) && (this_00 != (Bone *)0x0)) {
    Bone::AddChild(this_00,bone);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Failed to find bones for parenting: Child id ",0x2d);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," for parent id ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_01,local_1c0);
  *(undefined ***)this_01 = &PTR__runtime_error_008e3168;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadBoneParent(Skeleton *skeleton)
{
    uint16_t childId = Read<uint16_t>();
    uint16_t parentId = Read<uint16_t>();

    Bone *child = skeleton->BoneById(childId);
    Bone *parent = skeleton->BoneById(parentId);

    if (child && parent)
        parent->AddChild(child);
    else
        throw DeadlyImportError(Formatter::format() << "Failed to find bones for parenting: Child id " << childId << " for parent id " << parentId);
}